

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WAsmjsUtils.cpp
# Opt level: O3

void __thiscall
WAsmJs::TypedRegisterAllocator::CommitToFunctionInfo
          (TypedRegisterAllocator *this,AsmJsFunctionInfo *funcInfo,FunctionBody *body)

{
  long lVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  undefined4 *puVar7;
  undefined4 extraout_var;
  TypedSlotInfo *pTVar8;
  RegisterSpace *pRVar9;
  FunctionInfo *pFVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint *puVar14;
  Types type;
  long lVar15;
  ulong uVar16;
  uint32 result_1;
  uint uVar17;
  ulong uVar18;
  char16 local_a8 [4];
  char16 buf [16];
  undefined1 local_80 [8];
  TypedConstSourcesInfo constSourcesInfo;
  
  constSourcesInfo._16_8_ = this;
  GetConstSourceInfos((TypedConstSourcesInfo *)local_80,this);
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)body);
  pFVar10 = (body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar10 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_00959aa3;
    *puVar7 = 0;
    pFVar10 = (body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015b6718,AsmjsInterpreterStackPhase,uVar4,pFVar10->functionId);
  if (bVar3) {
    iVar5 = (*(body->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(body);
    Output::Print(L"ASMFunctionInfo Stack Data for %s\n",CONCAT44(extraout_var,iVar5));
    Output::Print(L"==========================\n");
    Output::Print(L"RequiredVarConstants:%d\n",5);
  }
  uVar16 = 0x28;
  puVar14 = &DAT_010f1828;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  lVar15 = 0;
  do {
    type = (Types)lVar15;
    pTVar8 = Js::AsmJsFunctionInfo::GetTypedSlotInfo(funcInfo,type);
    if ((*(uint *)constSourcesInfo._16_8_ >> (type & 0x1f) & 1) == 0) {
      pRVar9 = GetRegisterSpace((TypedRegisterAllocator *)constSourcesInfo._16_8_,type);
      uVar6 = pRVar9->mNbConst;
      pTVar8->constCount = uVar6;
      uVar13 = pRVar9->mFirstTmpReg;
      pTVar8->varCount = uVar13 - uVar6;
      uVar17 = pRVar9->mRegisterCount;
      pTVar8->tmpCount = uVar17 - uVar13;
      pTVar8->constSrcByteOffset = *(Type *)(local_80 + lVar15 * 4);
      uVar11 = -*puVar14 & ((uint)uVar16 + *puVar14) - 1;
      if ((((uVar11 < (uint)uVar16) || (pTVar8->byteOffset = uVar11, uVar13 < uVar6)) ||
          (uVar17 < uVar13)) ||
         ((lVar1 = (ulong)uVar17 * (ulong)*puVar14, uVar6 = (uint)lVar1,
          (int)((ulong)lVar1 >> 0x20) != 0 ||
          (uVar16 = (ulong)(uVar6 + uVar11), CARRY4(uVar6,uVar11))))) {
        Math::DefaultOverflowPolicy();
      }
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)body);
      pFVar10 = (body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar10 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar3) goto LAB_00959aa3;
        *puVar7 = 0;
        pFVar10 = (body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      bVar3 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015b6718,AsmjsInterpreterStackPhase,uVar4,
                         pFVar10->functionId);
      if (bVar3) {
        RegisterSpace::GetTypeDebugName(type,local_a8,0x10,false);
        Output::Print(L"%s Offset:%d  ConstCount:%d  VarCount:%d  TmpCount:%d = %d * %d = 0x%x bytes\n"
                      ,local_a8,(ulong)pTVar8->byteOffset,(ulong)pTVar8->constCount,
                      (ulong)pTVar8->varCount,(ulong)pTVar8->tmpCount,(ulong)uVar17,(ulong)*puVar14,
                      (ulong)(*puVar14 * uVar17));
      }
    }
    lVar15 = lVar15 + 1;
    puVar14 = puVar14 + 1;
  } while (lVar15 != 5);
  Js::AsmJsFunctionInfo::SetTotalSizeinBytes(funcInfo,(uint32)uVar16);
  uVar12 = (ulong)constSourcesInfo.srcByteOffsets[3] + 7 >> 3;
  uVar18 = uVar16 + 7 >> 3;
  uVar17 = (uint)uVar18;
  uVar6 = (uint)uVar12;
  uVar13 = uVar17 - uVar6;
  if (uVar17 < uVar6) {
    uVar13 = 0;
  }
  if (uVar13 + uVar6 < uVar17) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/WAsmjsUtils.cpp"
                       ,0x135,"((jsVarUsedForConstsTable + jsVarNeededForVars) >= totalVarsNeeded)",
                       "(jsVarUsedForConstsTable + jsVarNeededForVars) >= totalVarsNeeded");
    if (!bVar3) goto LAB_00959aa3;
    *puVar7 = 0;
  }
  Js::FunctionBody::CheckAndSetVarCount(body,uVar13);
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)body);
  pFVar10 = (body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar10 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) {
LAB_00959aa3:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
    pFVar10 = (body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015b6718,AsmjsInterpreterStackPhase,uVar4,pFVar10->functionId);
  if (bVar3) {
    Output::Print(L"Total memory required: (%u consts + %u vars) * sizeof(Js::Var) >= %u * sizeof(Js::Var) = 0x%x bytes\n"
                  ,uVar12,(ulong)uVar13,uVar18,uVar16);
  }
  return;
}

Assistant:

void TypedRegisterAllocator::CommitToFunctionInfo(Js::AsmJsFunctionInfo* funcInfo, Js::FunctionBody* body) const
    {
        uint32 offset = Js::AsmJsFunctionMemory::RequiredVarConstants * sizeof(Js::Var);
        WAsmJs::TypedConstSourcesInfo constSourcesInfo = GetConstSourceInfos();

#if DBG_DUMP
        if (PHASE_TRACE(Js::AsmjsInterpreterStackPhase, body))
        {
            Output::Print(_u("ASMFunctionInfo Stack Data for %s\n"), body->GetDisplayName());
            Output::Print(_u("==========================\n"));
            Output::Print(_u("RequiredVarConstants:%d\n"), Js::AsmJsFunctionMemory::RequiredVarConstants);
        }
#endif

        for (int i = 0; i < WAsmJs::LIMIT; ++i)
        {
            Types type = (Types)i;

            TypedSlotInfo& slotInfo = *funcInfo->GetTypedSlotInfo(type);
            // Check if we don't want to commit this type
            if (!IsTypeExcluded(type))
            {
                RegisterSpace* registerSpace = GetRegisterSpace(type);
                slotInfo.constCount = registerSpace->GetConstCount();
                slotInfo.varCount = registerSpace->GetVarCount();
                slotInfo.tmpCount = registerSpace->GetTmpCount();
                slotInfo.constSrcByteOffset = constSourcesInfo.srcByteOffsets[i];

                offset = Math::AlignOverflowCheck(offset, GetTypeByteSize(type));
                slotInfo.byteOffset = offset;

                // Update offset for next type
                uint32 totalTypeCount = 0;
                totalTypeCount = UInt32Math::Add(totalTypeCount, slotInfo.constCount);
                totalTypeCount = UInt32Math::Add(totalTypeCount, slotInfo.varCount);
                totalTypeCount = UInt32Math::Add(totalTypeCount, slotInfo.tmpCount);

                offset = UInt32Math::Add(offset, UInt32Math::Mul(totalTypeCount, GetTypeByteSize(type)));
#if DBG_DUMP
                if (PHASE_TRACE(Js::AsmjsInterpreterStackPhase, body))
                {
                    char16 buf[16];
                    RegisterSpace::GetTypeDebugName(type, buf, 16);
                    Output::Print(_u("%s Offset:%d  ConstCount:%d  VarCount:%d  TmpCount:%d = %d * %d = 0x%x bytes\n"),
                                  buf,
                                  slotInfo.byteOffset,
                                  slotInfo.constCount,
                                  slotInfo.varCount,
                                  slotInfo.tmpCount,
                                  totalTypeCount,
                                  GetTypeByteSize(type),
                                  totalTypeCount * GetTypeByteSize(type));
                }
#endif
            }
        }

        // The offset currently carries the total size of the funcInfo after handling the last type
        funcInfo->SetTotalSizeinBytes(offset);

        // These bytes offset already calculated the alignment, used them to determine how many Js::Var we need to do the allocation
        uint32 stackByteSize = offset;
        uint32 bytesUsedForConst = constSourcesInfo.bytesUsed;
        uint32 jsVarUsedForConstsTable = ConvertOffset<byte, Js::Var>(bytesUsedForConst);
        uint32 totalVarsNeeded = ConvertOffset<byte, Js::Var>(stackByteSize);

        uint32 jsVarNeededForVars = totalVarsNeeded - jsVarUsedForConstsTable;
        if (totalVarsNeeded < jsVarUsedForConstsTable)
        {
            // If for some reason we allocated more space in the const table than what we need, just don't allocate anymore vars
            jsVarNeededForVars = 0;
        }

        Assert((jsVarUsedForConstsTable + jsVarNeededForVars) >= totalVarsNeeded);
        body->CheckAndSetVarCount(jsVarNeededForVars);

#if DBG_DUMP
        if (PHASE_TRACE(Js::AsmjsInterpreterStackPhase, body))
        {
            Output::Print(_u("Total memory required: (%u consts + %u vars) * sizeof(Js::Var) >= %u * sizeof(Js::Var) = 0x%x bytes\n"),
                          jsVarUsedForConstsTable,
                          jsVarNeededForVars,
                          totalVarsNeeded,
                          stackByteSize);
        }
#endif
    }